

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O1

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  atomic<bool> *paVar1;
  task_handle *ptVar2;
  __pid_t _Var3;
  notifier<(oqpi::task_type)1,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  *this_00;
  void *in_RSI;
  task_handle *hTask;
  task_handle *this_01;
  bool bVar4;
  
  ptVar2 = (this->tasks_).super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->tasks_).
                 super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != ptVar2; this_01 = this_01 + 1) {
    task_handle::validate(this_01);
    paVar1 = &((this_01->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->grabbed_;
    LOCK();
    bVar4 = (paVar1->_M_base)._M_i == false;
    if (bVar4) {
      (paVar1->_M_base)._M_i = true;
    }
    UNLOCK();
    if (bVar4) {
      task_handle::execute(this_01);
    }
  }
  this_00 = &(this->
             super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             ).
             super_notifier<(oqpi::task_type)1,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ;
  _Var3 = posix_semaphore_wrapper::wait((posix_semaphore_wrapper *)this_00,in_RSI);
  if ((char)_Var3 != '\0') {
    posix_semaphore_wrapper::post((posix_semaphore_wrapper *)this_00);
    return;
  }
  return;
}

Assistant:

virtual void activeWait() override final
        {
            for (auto &hTask : tasks_)
            {
                if (hTask.tryGrab())
                {
                    hTask.execute();
                }
            }

            this->wait();
        }